

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O1

shared_ptr<tchecker::parsing::system_declaration_t> load_system_declaration(string *filename)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  string *in_RSI;
  system_declaration_t *__tmp;
  shared_ptr<tchecker::parsing::system_declaration_t> sVar4;
  pointer local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  (filename->_M_dataplus)._M_p = (pointer)0x0;
  filename->_M_string_length = 0;
  sVar4 = tchecker::parsing::parse_system_declaration((parsing *)&local_38,in_RSI);
  p_Var2 = p_Stack_30;
  pcVar1 = local_38;
  _Var3 = sVar4.
          super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_38 = (pointer)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (filename->_M_dataplus)._M_p = pcVar1;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)filename->_M_string_length;
  filename->_M_string_length = (size_type)p_Var2;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    _Var3._M_pi = extraout_RDX;
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (pcVar1 != (pointer)0x0) {
    sVar4.super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    sVar4.super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)filename;
    return (shared_ptr<tchecker::parsing::system_declaration_t>)
           sVar4.
           super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"nullptr system declaration");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<tchecker::parsing::system_declaration_t> load_system_declaration(std::string const & filename)
{
  std::shared_ptr<tchecker::parsing::system_declaration_t> sysdecl{nullptr};
  try {
    sysdecl = tchecker::parsing::parse_system_declaration(filename);
    if (sysdecl == nullptr)
      throw std::runtime_error("nullptr system declaration");
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << e.what() << std::endl;
  }
  return sysdecl;
}